

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_bitmapblit_quint16
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  ushort value;
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  uchar uVar7;
  int iVar8;
  uchar *local_60;
  
  value = QRgba64::toRgb16(color);
  puVar5 = rasterBuffer->m_buffer + (long)x * 2 + (long)y * rasterBuffer->bytes_per_line;
  lVar2 = (long)(int)((ulong)rasterBuffer->bytes_per_line >> 1);
  local_60 = map;
  if (mapWidth < 9) {
    while (0 < mapHeight) {
      mapHeight = mapHeight + -1;
      uVar7 = *local_60;
      iVar6 = 0;
      iVar4 = 0;
      while( true ) {
        if (uVar7 == '\0') break;
        if ((char)uVar7 < '\0') {
          iVar4 = iVar4 + 1;
        }
        else {
          if (iVar4 != 0) {
            qt_memfill16((quint16 *)(puVar5 + (long)iVar6 * 2),value,(long)iVar4);
            iVar6 = iVar6 + iVar4;
          }
          iVar6 = iVar6 + 1;
          iVar4 = 0;
        }
        uVar7 = uVar7 * '\x02';
      }
      if (iVar4 != 0) {
        qt_memfill16((quint16 *)(puVar5 + (long)iVar6 * 2),value,(long)iVar4);
      }
      puVar5 = puVar5 + lVar2 * 2;
      local_60 = local_60 + mapStride;
    }
  }
  else {
    while (0 < mapHeight) {
      mapHeight = mapHeight + -1;
      iVar6 = 0;
      iVar4 = 0;
      for (uVar3 = 0; uVar3 < (uint)mapWidth; uVar3 = uVar3 + 8) {
        uVar7 = local_60[uVar3 >> 3];
        for (iVar8 = -8; iVar8 != 0; iVar8 = iVar8 + 1) {
          if ((char)uVar7 < '\0') {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar1 = 1;
            if (iVar4 != 0) {
              qt_memfill16((quint16 *)(puVar5 + (long)iVar6 * 2),value,(long)iVar4);
              iVar1 = iVar4 + 1;
            }
            if (uVar7 == '\0') {
              iVar6 = (iVar4 + iVar6) - iVar8;
              iVar4 = 0;
              break;
            }
            iVar6 = iVar6 + iVar1;
            iVar4 = 0;
          }
          uVar7 = uVar7 * '\x02';
        }
      }
      if (iVar4 != 0) {
        qt_memfill16((quint16 *)(puVar5 + (long)iVar6 * 2),value,(long)iVar4);
      }
      puVar5 = puVar5 + lVar2 * 2;
      local_60 = local_60 + mapStride;
    }
  }
  return;
}

Assistant:

inline static void qt_bitmapblit_quint16(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    qt_bitmapblit_template<quint16>(rasterBuffer, x,  y, color.toRgb16(),
                                    map, mapWidth, mapHeight, mapStride);
}